

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:645:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:645:3)>
      *this)

{
  char *in_stack_ffffffffffffffd8;
  size_t sStack_20;
  ArrayDisposer *local_18;
  
  kj::anon_unknown_0::tryParse
            ((String *)&stack0xffffffffffffffd8,(anon_unknown_0 *)(this->func).w,
             (WaitScope *)((this->func).restrictedNetwork)->ptr,(Network *)"unix:/foo",
             (StringPtr)ZEXT816(10),(uint)in_stack_ffffffffffffffd8);
  if (in_stack_ffffffffffffffd8 != (char *)0x0) {
    (**local_18->_vptr_ArrayDisposer)(local_18,in_stack_ffffffffffffffd8,1,sStack_20,sStack_20,0);
  }
  return;
}

Assistant:

void run() override {
    func();
  }